

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode tool_setopt(CURL *curl,_Bool str,GlobalConfig *global,OperationConfig *config,char *name,
                    CURLoption tag,...)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  NameValue *in_stack_00000008;
  size_t local_1b0;
  curl_off_t len;
  void *pblob;
  curl_off_t oval;
  void *pval;
  NameValue *nv;
  long defval;
  long lval;
  char *pcStack_170;
  CURLcode ret;
  char *escaped;
  _Bool escape;
  _Bool skip;
  char *pcStack_160;
  _Bool remark;
  char *value;
  char buf [256];
  va_list arg;
  CURLoption tag_local;
  char *name_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  _Bool str_local;
  CURL *curl_local;
  
  if (tag < 10000) {
    buf[0xfc] = '0';
    buf[0xfd] = '\0';
    buf[0xfe] = '\0';
    buf[0xff] = '\0';
    buf[0xf8] = '0';
    buf[0xf9] = '\0';
    buf[0xfa] = '\0';
    buf[0xfb] = '\0';
    escaped._7_1_ = false;
    bVar1 = false;
    nv = (NameValue *)0x0;
    for (pval = setopt_nv_CURLNONZERODEFAULTS; *pval != 0; pval = (void *)((long)pval + 0x10)) {
      iVar2 = strcmp(name,*pval);
      if (iVar2 == 0) {
        nv = *(NameValue **)((long)pval + 8);
        break;
      }
    }
    curl_msnprintf(&value,0x100,"%ldL",in_stack_00000008);
    pcStack_160 = (char *)&value;
    lval._4_4_ = curl_easy_setopt(curl,tag,in_stack_00000008);
    escaped._6_1_ = in_stack_00000008 == nv;
  }
  else if (tag < 30000) {
    buf[0xfc] = '0';
    buf[0xfd] = '\0';
    buf[0xfe] = '\0';
    buf[0xff] = '\0';
    buf[0xf8] = '0';
    buf[0xf9] = '\0';
    buf[0xfa] = '\0';
    buf[0xfb] = '\0';
    pcStack_160 = (char *)0x0;
    escaped._7_1_ = false;
    escaped._6_1_ = false;
    bVar1 = false;
    if (tag < 20000) {
      if ((in_stack_00000008 == (NameValue *)0x0) || (!str)) {
        escaped._6_1_ = in_stack_00000008 == (NameValue *)0x0;
        if (!escaped._6_1_) {
          pcStack_160 = "object pointer";
        }
        escaped._7_1_ = !escaped._6_1_;
      }
      else {
        bVar1 = true;
        pcStack_160 = (char *)in_stack_00000008;
      }
    }
    else {
      escaped._6_1_ = in_stack_00000008 == (NameValue *)0x0;
      if (!escaped._6_1_) {
        pcStack_160 = "function pointer";
      }
      escaped._7_1_ = !escaped._6_1_;
    }
    lval._4_4_ = curl_easy_setopt(curl,tag,in_stack_00000008);
  }
  else {
    if (tag < 40000) {
      buf[0xfc] = '0';
      buf[0xfd] = '\0';
      buf[0xfe] = '\0';
      buf[0xff] = '\0';
      buf[0xf8] = '0';
      buf[0xf9] = '\0';
      buf[0xfa] = '\0';
      buf[0xfb] = '\0';
      escaped._7_1_ = false;
      curl_msnprintf(&value,0x100,"(curl_off_t)%ld",in_stack_00000008);
      pcStack_160 = (char *)&value;
      lval._4_4_ = curl_easy_setopt(curl,tag,in_stack_00000008);
    }
    else {
      buf[0xfc] = '0';
      buf[0xfd] = '\0';
      buf[0xfe] = '\0';
      buf[0xff] = '\0';
      buf[0xf8] = '0';
      buf[0xf9] = '\0';
      buf[0xfa] = '\0';
      buf[0xfb] = '\0';
      pcStack_160 = (char *)0x0;
      escaped._7_1_ = in_stack_00000008 != (NameValue *)0x0;
      if (escaped._7_1_) {
        pcStack_160 = "blob pointer";
      }
      lval._4_4_ = curl_easy_setopt(curl,tag,in_stack_00000008);
    }
    escaped._6_1_ = in_stack_00000008 == (NameValue *)0x0;
    bVar1 = false;
  }
  pcStack_170 = (char *)0x0;
  if (((global->libcurl != (char *)0x0) && (!escaped._6_1_)) && (lval._4_4_ == CURLE_OK)) {
    if (escaped._7_1_) {
      pcVar3 = "";
      if (*(char *)&((NameValue *)pcStack_160)->name == 'o') {
        pcVar3 = "n";
      }
      lval._4_4_ = easysrc_addf(&easysrc_toohard,"%s was set to a%s %s",name,pcVar3,pcStack_160);
    }
    else if (bVar1) {
      local_1b0 = 0xffffffffffffffff;
      if (tag == CURLOPT_POSTFIELDS) {
        local_1b0 = curlx_dyn_len(&config->postdata);
      }
      pcStack_170 = c_escape(pcStack_160,local_1b0);
      if (pcStack_170 == (char *)0x0) {
        lval._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        lval._4_4_ = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, \"%s\");",name,
                                  pcStack_170);
      }
    }
    else {
      lval._4_4_ = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, %s);",name,pcStack_160);
    }
  }
  free(pcStack_170);
  return lval._4_4_;
}

Assistant:

CURLcode tool_setopt(CURL *curl, bool str, struct GlobalConfig *global,
                     struct OperationConfig *config,
                     const char *name, CURLoption tag, ...)
{
  va_list arg;
  char buf[256];
  const char *value = NULL;
  bool remark = FALSE;
  bool skip = FALSE;
  bool escape = FALSE;
  char *escaped = NULL;
  CURLcode ret = CURLE_OK;

  va_start(arg, tag);

  if(tag < CURLOPTTYPE_OBJECTPOINT) {
    /* Value is expected to be a long */
    long lval = va_arg(arg, long);
    long defval = 0L;
    const struct NameValue *nv = NULL;
    for(nv = setopt_nv_CURLNONZERODEFAULTS; nv->name; nv++) {
      if(!strcmp(name, nv->name)) {
        defval = nv->value;
        break; /* found it */
      }
    }

    msnprintf(buf, sizeof(buf), "%ldL", lval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, lval);
    if(lval == defval)
      skip = TRUE;
  }
  else if(tag < CURLOPTTYPE_OFF_T) {
    /* Value is some sort of object pointer */
    void *pval = va_arg(arg, void *);

    /* function pointers are never printable */
    if(tag >= CURLOPTTYPE_FUNCTIONPOINT) {
      if(pval) {
        value = "function pointer";
        remark = TRUE;
      }
      else
        skip = TRUE;
    }

    else if(pval && str) {
      value = (char *)pval;
      escape = TRUE;
    }
    else if(pval) {
      value = "object pointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pval);

  }
  else if(tag < CURLOPTTYPE_BLOB) {
    /* Value is expected to be curl_off_t */
    curl_off_t oval = va_arg(arg, curl_off_t);
    msnprintf(buf, sizeof(buf),
              "(curl_off_t)%" CURL_FORMAT_CURL_OFF_T, oval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, oval);

    if(!oval)
      skip = TRUE;
  }
  else {
    /* Value is a blob */
    void *pblob = va_arg(arg, void *);

    /* blobs are never printable */
    if(pblob) {
      value = "blob pointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pblob);
  }

  va_end(arg);

  if(global->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */

    if(remark)
      REM3("%s was set to a%s %s", name, (*value == 'o' ? "n" : ""), value);
    else {
      if(escape) {
        curl_off_t len = ZERO_TERMINATED;
        if(tag == CURLOPT_POSTFIELDS)
          len = curlx_dyn_len(&config->postdata);
        escaped = c_escape(value, len);
        NULL_CHECK(escaped);
        CODE2("curl_easy_setopt(hnd, %s, \"%s\");", name, escaped);
      }
      else
        CODE2("curl_easy_setopt(hnd, %s, %s);", name, value);
    }
  }

nomem:
  Curl_safefree(escaped);
  return ret;
}